

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlinePolymorphicFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,uint recursiveInlineDepth,bool triedUsingFixedMethods
          )

{
  Instr *instrNext;
  Opnd *pOVar1;
  _func_int **pp_Var2;
  SymOpnd *this_00;
  ScriptContext *scriptContext;
  RegOpnd *baseOpnd;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  ArgSlot AVar6;
  uint uVar7;
  undefined4 *puVar8;
  FunctionJITTimeInfo *pFVar9;
  PropertySymOpnd *pPVar10;
  FunctionJITTimeInfo *pFVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  LabelInstr *doneLabel;
  LabelInstr *instr;
  LabelInstr *pLVar17;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  IndirOpnd *src1Opnd;
  intptr_t address;
  AddrOpnd *src2Opnd;
  BranchInstr *instr_00;
  StackSym *pSVar18;
  ThreadContext *this_01;
  _func_int *p_Var19;
  ulong uVar20;
  uint i;
  wchar local_158 [4];
  char16 debugStringBuffer [42];
  wchar local_f8 [4];
  char16 debugStringBuffer2 [42];
  FunctionJITTimeInfo *pFStack_98;
  FunctionJITTimeInfo *inlineesDataArray [4];
  RegOpnd *local_40;
  
  instrNext = callInstr->m_next;
  *pIsInlined = false;
  inlineesDataArray[3] = (FunctionJITTimeInfo *)symCallerThis;
  if (triedUsingFixedMethods) {
    pOVar1 = callInstr->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar1);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00541d3d;
      *puVar8 = 0;
    }
    pp_Var2 = pOVar1[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar5) goto LAB_00541d3d;
      *puVar8 = 0;
    }
    if ((((ulong)pp_Var2[3] & 1) != 0) && (pp_Var2[5] != (_func_int *)0x0)) {
      pOVar1 = callInstr->m_src1;
      OVar4 = IR::Opnd::GetKind(pOVar1);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00541d3d;
        *puVar8 = 0;
      }
      pp_Var2 = pOVar1[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00541d3d;
        *puVar8 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) {
        p_Var19 = (_func_int *)0x0;
      }
      else {
        p_Var19 = pp_Var2[5];
      }
      OVar4 = IR::Opnd::GetKind(*(Opnd **)(p_Var19 + 0x48));
      if (OVar4 == OpndKindSym) {
        this_00 = *(SymOpnd **)(p_Var19 + 0x48);
        OVar4 = IR::Opnd::GetKind(&this_00->super_Opnd);
        if (OVar4 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar5) goto LAB_00541d3d;
          *puVar8 = 0;
        }
        bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
        if (bVar5) {
          pPVar10 = IR::Opnd::AsPropertySymOpnd(*(Opnd **)(p_Var19 + 0x48));
          if ((pPVar10 != (PropertySymOpnd *)0x0) &&
             (bVar5 = IR::PropertySymOpnd::ShouldResetObjTypeSpecFldInfo(pPVar10), bVar5)) {
            pPVar10->objTypeSpecFldInfo = (ObjTypeSpecFldInfo *)0x0;
            pPVar10->field_0x61 = pPVar10->field_0x61 & 0xfe;
            pPVar10->slotIndex = 0;
          }
          pPVar10 = IR::Opnd::AsPropertySymOpnd(*(Opnd **)(p_Var19 + 0x48));
          if (((pPVar10 != (PropertySymOpnd *)0x0) &&
              (pPVar10->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
             (-1 < (char)pPVar10->m_polyCacheUtil)) {
            pPVar10->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
          }
        }
      }
    }
    pSVar18 = (StackSym *)inlinerData;
    pFVar11 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  }
  else {
    pFVar11 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
    pFVar9 = FunctionJITTimeInfo::GetNext(pFVar11);
    if (pFVar9 == (FunctionJITTimeInfo *)0x0) {
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
      if (!bVar5) {
        return instrNext;
      }
      pJVar12 = FunctionJITTimeInfo::GetBody(pFVar11);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_158);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
      Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                    ,pcVar13,pcVar14,pcVar15,pcVar16);
      goto LAB_0054199a;
    }
    pSVar18 = (StackSym *)callInstr->m_src2;
    if ((pSVar18 != (StackSym *)0x0) &&
       (OVar4 = IR::Opnd::GetKind((Opnd *)pSVar18), OVar4 == OpndKindSym)) {
      pOVar1 = callInstr->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar1);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00541d3d;
        *puVar8 = 0;
      }
      pSVar18 = (StackSym *)pOVar1[1]._vptr_Opnd;
      if ((pSVar18->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00541d3d;
        *puVar8 = 0;
      }
      AVar6 = StackSym::GetArgSlotNum(pSVar18);
      if (0xf < AVar6) {
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
        if (!bVar5) {
          return instrNext;
        }
        pJVar12 = FunctionJITTimeInfo::GetBody(pFVar11);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_158);
        pOVar1 = callInstr->m_src2;
        OVar4 = IR::Opnd::GetKind(pOVar1);
        if (OVar4 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar5) goto LAB_00541d3d;
          *puVar8 = 0;
        }
        pSVar18 = (StackSym *)pOVar1[1]._vptr_Opnd;
        if ((pSVar18->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar5) goto LAB_00541d3d;
          *puVar8 = 0;
        }
        AVar6 = StackSym::GetArgSlotNum(pSVar18);
        pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
        Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,pcVar13,pcVar14,(ulong)AVar6,0xf,pcVar15,pcVar16);
        goto LAB_0054199a;
      }
    }
  }
  inlineesDataArray[1] = (FunctionJITTimeInfo *)0x0;
  inlineesDataArray[2] = (FunctionJITTimeInfo *)0x0;
  pFStack_98 = (FunctionJITTimeInfo *)0x0;
  inlineesDataArray[0] = (FunctionJITTimeInfo *)0x0;
  uVar7 = FillInlineesDataArray((Inline *)pSVar18,pFVar11,&pFStack_98,4);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
  if (0xfffffffc < uVar7 - 5) {
    if (bVar5) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    uVar20 = 0;
    do {
      pFVar11 = inlineesDataArray[uVar20 - 1];
      pJVar12 = FunctionJITTimeInfo::GetBody(pFVar11);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
      if (bVar5) {
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_158);
        pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
        Output::Print(L"INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,pcVar13,pcVar14,pcVar15,pcVar16);
        Output::Flush();
      }
      uVar20 = uVar20 + 1;
    } while (uVar7 != uVar20);
    this_01 = (ThreadContext *)&DAT_015bc490;
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
    if (bVar5) {
      this_01 = (ThreadContext *)0x10061a8;
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    *pIsInlined = true;
    if (this->topFunc->m_isBackgroundJIT == false) {
      scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
      this_01 = scriptContext->threadContext;
      ThreadContext::ProbeStackNoDispose(this_01,0xc00,scriptContext,(PVOID)0x0);
    }
    if (callInstr->m_dst == (Opnd *)0x0) {
      local_40 = (RegOpnd *)0x0;
    }
    else {
      local_40 = (RegOpnd *)IR::Instr::UnlinkDst(callInstr);
      OVar4 = IR::Opnd::GetKind((Opnd *)local_40);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00541d3d:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      this_01 = (ThreadContext *)local_40->m_sym;
      StackSym::GetByteCodeRegSlot((StackSym *)this_01);
    }
    InsertJsFunctionCheck((Inline *)this_01,callInstr,callInstr,BailOutOnPolymorphicInlineFunction);
    IR::Instr::MoveArgs(callInstr,true);
    uVar20 = 0;
    doneLabel = IR::LabelInstr::New(Label,callInstr->m_func,false);
    instr = IR::LabelInstr::New(Label,callInstr->m_func,false);
    IR::Instr::InsertBefore(callInstr,&instr->super_Instr);
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pLVar17 = IR::LabelInstr::New(Label,callInstr->m_func,false);
      IR::Instr::InsertBefore(callInstr,&pLVar17->super_Instr);
      pOVar1 = callInstr->m_src1;
      pFVar11 = inlineesDataArray[uVar20 - 1];
      inlineeRuntimeData = FunctionJITTimeInfo::GetRuntimeInfo(pFVar11);
      InsertOneInlinee(this,callInstr,local_40,pOVar1,pFVar11,inlineeRuntimeData,doneLabel,
                       (StackSym *)inlineesDataArray[3],false,recursiveInlineDepth);
      baseOpnd = (RegOpnd *)callInstr->m_src1;
      OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00541d3d;
        *puVar8 = 0;
      }
      src1Opnd = IR::IndirOpnd::New(baseOpnd,0x28,TyUint64,(instr->super_Instr).m_func,false);
      address = FunctionJITTimeInfo::GetFunctionInfoAddr(pFVar11);
      src2Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicFunctionInfo,
                                   (instr->super_Instr).m_func,false,(Var)0x0);
      instr_00 = IR::BranchInstr::New
                           (BrAddr_A,pLVar17,&src1Opnd->super_Opnd,&src2Opnd->super_Opnd,
                            (instr->super_Instr).m_func);
      pLVar17 = instr;
      IR::Instr::InsertBefore(&instr->super_Instr,&instr_00->super_Instr);
      uVar20 = uVar20 + 1;
      if (uVar7 == uVar20) {
        CompletePolymorphicInlining
                  ((Inline *)pLVar17,callInstr,local_40,doneLabel,&instr->super_Instr,(Instr *)0x0,
                   BailOutOnPolymorphicInlineFunction);
        Func::SetHasInlinee(this->topFunc);
        InsertStatementBoundary(this,instrNext);
        return instrNext;
      }
    } while( true );
  }
  if (!bVar5) {
    return instrNext;
  }
  pJVar12 = FunctionJITTimeInfo::GetBody(pFVar11);
  pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
  pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])local_158);
  pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
  pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
  pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
  Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                ,(ulong)uVar7,4,pcVar13,pcVar14,pcVar15,pcVar16);
LAB_0054199a:
  Output::Flush();
  return instrNext;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, uint recursiveInlineDepth, bool triedUsingFixedMethods)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;


    if (triedUsingFixedMethods)
    {
        if (callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
        {
            IR::Instr* ldMethodFldInstr = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
            if (ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
            {
                TryResetObjTypeSpecFldInfoOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
                TryDisableRuntimePolymorphicCacheOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
            }
        }
    }

    const FunctionJITTimeInfo * inlineeJitTimeData = inlinerData->GetInlinee(profileId);
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (!triedUsingFixedMethods) // We would have done the following two checks when we tried to inline using fixed methods
    {
        if(!inlineeJitTimeData->GetNext())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            //There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
            return instrNext;
        }

        if (callInstr->GetSrc2() &&
            callInstr->GetSrc2()->IsSymOpnd() &&
            callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
            // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
            // data matching does not take into account some types of changes to source code. Need to check this again with current
            // information.
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
                Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            return instrNext;
        }
    }

    const FunctionJITTimeInfo * inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    uint inlineeCount = FillInlineesDataArray(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        return instrNext;
    }

    // Begin inlining.
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < inlineeCount; i++)
    {
        __analysis_assert(inlineesDataArray[i] != nullptr);
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    *pIsInlined = true;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    Assert(inlineeCount >= 2);

    // Shared bailout point for all the guard check bailouts.
    InsertJsFunctionCheck(callInstr, callInstr, IR::BailOutOnPolymorphicInlineFunction);

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for (uint i = 0; i < inlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);
        InsertOneInlinee(callInstr, returnValueOpnd, callInstr->GetSrc1(), inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, /*fixedFunctionSafeThis*/ false, recursiveInlineDepth);

        IR::RegOpnd* functionObject = callInstr->GetSrc1()->AsRegOpnd();
        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            IR::IndirOpnd::New(functionObject, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, dispatchStartLabel->m_func),
            IR::AddrOpnd::New(inlineesDataArray[i]->GetFunctionInfoAddr(), IR::AddrOpndKindDynamicFunctionInfo, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
    }

    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, /*ldMethodFldInstr*/nullptr, IR::BailOutOnPolymorphicInlineFunction);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);

    return instrNext;

}